

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O0

nng_err nng_http_handler_alloc(nng_http_handler **hp,char *uri,nng_http_handler_func cb)

{
  nng_err nVar1;
  nng_http_handler_func cb_local;
  char *uri_local;
  nng_http_handler **hp_local;
  
  nVar1 = nni_http_handler_init(hp,uri,cb);
  return nVar1;
}

Assistant:

nng_err
nng_http_handler_alloc(
    nng_http_handler **hp, const char *uri, nng_http_handler_func cb)
{
#ifdef NNG_SUPP_HTTP
	return (nni_http_handler_init(hp, uri, cb));
#else
	NNI_ARG_UNUSED(hp);
	NNI_ARG_UNUSED(uri);
	NNI_ARG_UNUSED(cb);
	return (NNG_ENOTSUP);
#endif
}